

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

path * __thiscall ghc::filesystem::path::lexically_normal(path *__return_storage_ptr__,path *this)

{
  bool bVar1;
  __type _Var2;
  bool bVar3;
  path root;
  string_type s;
  iterator __begin2;
  iterator __end2;
  iterator local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_path)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->_path).field_2;
  (__return_storage_ptr__->_path)._M_string_length = 0;
  (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
  begin(&__begin2,this);
  end(&__end2,this);
  bVar3 = false;
  do {
    if (__begin2._iter._M_current == __end2._iter._M_current) {
      std::__cxx11::string::~string((string *)&__end2._current);
      std::__cxx11::string::~string((string *)&__begin2._current);
      if ((__return_storage_ptr__->_path)._M_string_length == 0) {
        assign<char[2]>(__return_storage_ptr__,(char (*) [2])0x17c739);
      }
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string((string *)&s,(string *)&__begin2._current);
    bVar1 = std::operator==(&s,".");
    if (bVar1) {
      append<char[1]>(__return_storage_ptr__,(char (*) [1])0x17e102);
    }
    else {
      bVar1 = std::operator==(&s,"..");
      if ((bVar1) && ((__return_storage_ptr__->_path)._M_string_length != 0)) {
        root_path((path *)&root._path,this);
        _Var2 = std::operator==(&__return_storage_ptr__->_path,&root._path);
        if (!_Var2) {
          end(&local_90,__return_storage_ptr__);
          iterator::operator--(&local_90);
          path<char[3],ghc::filesystem::path>((path *)&local_50,(char (*) [3])"..",auto_format);
          bVar1 = std::operator!=(&local_90._current._path,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_90._current);
          if (!bVar1) {
            std::__cxx11::string::~string((string *)&root);
            goto LAB_0014a4d3;
          }
          if ((__return_storage_ptr__->_path)._M_dataplus._M_p
              [(__return_storage_ptr__->_path)._M_string_length - 1] == '/') {
            std::__cxx11::string::pop_back();
          }
          remove_filename(__return_storage_ptr__);
        }
        std::__cxx11::string::~string((string *)&root);
      }
      else {
LAB_0014a4d3:
        if ((bVar3 & s._M_string_length == 0) == 0) {
          append<std::__cxx11::string>(__return_storage_ptr__,&s);
        }
        bVar3 = std::operator==(&s,"..");
      }
    }
    std::__cxx11::string::~string((string *)&s);
    iterator::operator++(&__begin2);
  } while( true );
}

Assistant:

GHC_INLINE path path::lexically_normal() const
{
    path dest;
    bool lastDotDot = false;
    for (string_type s : *this) {
        if (s == ".") {
            dest /= "";
            continue;
        }
        else if (s == ".." && !dest.empty()) {
            auto root = root_path();
            if (dest == root) {
                continue;
            }
            else if (*(--dest.end()) != "..") {
                if (dest._path.back() == generic_separator) {
                    dest._path.pop_back();
                }
                dest.remove_filename();
                continue;
            }
        }
        if (!(s.empty() && lastDotDot)) {
            dest /= s;
        }
        lastDotDot = s == "..";
    }
    if (dest.empty()) {
        dest = ".";
    }
    return dest;
}